

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileInputSource.cc
# Opt level: O0

void __thiscall FileInputSource::~FileInputSource(FileInputSource *this)

{
  FileInputSource *this_local;
  
  (this->super_InputSource)._vptr_InputSource = (_func_int **)&PTR__FileInputSource_0058ab50;
  if ((this->file != (FILE *)0x0) && ((this->close_file & 1U) != 0)) {
    fclose((FILE *)this->file);
  }
  std::__cxx11::string::~string((string *)&this->filename);
  InputSource::~InputSource(&this->super_InputSource);
  return;
}

Assistant:

FileInputSource::~FileInputSource()
{
    // Must be explicit and not inline -- see QPDF_DLL_CLASS in README-maintainer
    if (this->file && this->close_file) {
        fclose(this->file);
    }
}